

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holoPlay.cpp
# Opt level: O0

void __thiscall
vera::QuiltProperties::QuiltProperties
          (QuiltProperties *this,int _width,int _height,int _cols,int _rows)

{
  int _rows_local;
  int _cols_local;
  int _height_local;
  int _width_local;
  QuiltProperties *this_local;
  
  this->width = 0x800;
  this->height = 0x800;
  this->columns = 4;
  this->rows = 8;
  this->totalViews = 0x20;
  this->width = _width;
  this->height = _height;
  this->columns = _cols;
  this->rows = _rows;
  this->totalViews = _cols * _rows;
  return;
}

Assistant:

QuiltProperties::QuiltProperties(int _width, int _height, int _cols, int _rows) {
    width = _width;
    height = _height;
    columns = _cols;
    rows = _rows;
    totalViews = _cols * _rows;
}